

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::Scope(Scope<hgdb::json::VarStmt> *this,uint32_t line)

{
  uint32_t local_14;
  Scope<hgdb::json::VarStmt> *pSStack_10;
  uint32_t line_local;
  Scope<hgdb::json::VarStmt> *this_local;
  
  local_14 = line;
  pSStack_10 = this;
  ScopeBase::ScopeBase(&this->super_ScopeBase);
  (this->super_ScopeBase)._vptr_ScopeBase = (_func_int **)&PTR_serialize_0058b750;
  std::__cxx11::string::string((string *)&this->filename);
  std::optional<unsigned_int>::optional<unsigned_int_&,_true>(&this->line_num,&local_14);
  this->column_num = 0;
  std::__cxx11::string::string((string *)&this->condition);
  return;
}

Assistant:

explicit Scope(uint32_t line) : line_num(line) {}